

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O2

void __thiscall
skiplist<int,_std::less<int>_>::insert(skiplist<int,_std::less<int>_> *this,int value)

{
  pointer ppSVar1;
  int iVar2;
  SLNode<int> **ppSVar3;
  SLNode<int> *pSVar4;
  SLNode<int> *pSVar5;
  SLNode<int> *pSVar6;
  result_type_conflict1 rVar7;
  int value_local;
  SLNode<int> *local_58;
  SLNode<int> *keyd;
  vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_> history;
  
  this->size_ = this->size_ + 1;
  ppSVar1 = (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  value_local = value;
  if ((this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppSVar1) {
    pSVar5 = (SLNode<int> *)operator_new(0x48);
    pSVar5->back = (SLNode<int> *)0x0;
    pSVar5->next = (SLNode<int> *)0x0;
    pSVar5->up = (SLNode<int> *)0x0;
    pSVar5->down = (SLNode<int> *)0x0;
    pSVar5->val = value;
    (pSVar5->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (pSVar5->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (pSVar5->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pSVar5->count = 1;
    history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x48);
    *history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
     super__Vector_impl_data._M_start = (SLNode<int> *)0x0;
    history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
    super__Vector_impl_data._M_start[1] = (SLNode<int> *)0x0;
    history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
    super__Vector_impl_data._M_start[2] = (SLNode<int> *)0x0;
    history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
    super__Vector_impl_data._M_start[3] = (SLNode<int> *)0x0;
    history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
    super__Vector_impl_data._M_start[5] = (SLNode<int> *)0x0;
    history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
    super__Vector_impl_data._M_start[6] = (SLNode<int> *)0x0;
    *(undefined8 *)
     ((long)history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
            super__Vector_impl_data._M_start + 0x34) = 0;
    *(undefined8 *)
     ((long)history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
            super__Vector_impl_data._M_start + 0x3c) = 0;
    std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::push_back
              (&this->key,(value_type *)&history);
    ppSVar1 = (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    (*ppSVar1)->next = pSVar5;
    pSVar5->back = *ppSVar1;
    this->last = pSVar5;
    std::vector<int,_std::allocator<int>_>::push_back(&pSVar5->valz,&value_local);
    while (rVar7 = std::uniform_real_distribution<double>::operator()(&this->dist_,&this->mt_),
          0.5 < rVar7) {
      pSVar6 = (SLNode<int> *)operator_new(0x48);
      pSVar6->back = (SLNode<int> *)0x0;
      pSVar6->next = (SLNode<int> *)0x0;
      pSVar6->up = (SLNode<int> *)0x0;
      pSVar6->val = value_local;
      (pSVar6->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      (pSVar6->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (pSVar6->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      pSVar6->count = 1;
      pSVar5->up = pSVar6;
      pSVar6->down = pSVar5;
      pSVar5 = (SLNode<int> *)operator_new(0x48);
      pSVar5->back = (SLNode<int> *)0x0;
      pSVar5->next = (SLNode<int> *)0x0;
      pSVar5->up = (SLNode<int> *)0x0;
      (pSVar5->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (pSVar5->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      *(undefined8 *)
       ((long)&(pSVar5->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish + 4) = 0;
      *(undefined8 *)
       ((long)&(pSVar5->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4) = 0;
      history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start[2] = pSVar5;
      pSVar5->down = (SLNode<int> *)
                     history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      pSVar5->next = pSVar6;
      pSVar6->back = pSVar5;
      history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pSVar5;
      std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::push_back
                (&this->key,(value_type *)&history);
      pSVar5 = pSVar6;
    }
  }
  else {
    history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ppSVar3 = ppSVar1 + -1;
    while (iVar2 = value_local, pSVar5 = *ppSVar3, pSVar5->down != (SLNode<int> *)0x0) {
      do {
        local_58 = pSVar5;
        pSVar5 = local_58->next;
        if (pSVar5 == (SLNode<int> *)0x0) break;
      } while (pSVar5->val < value_local);
      std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::push_back(&history,&local_58);
      ppSVar3 = &local_58->down;
    }
    do {
      pSVar6 = pSVar5;
      local_58 = pSVar6->next;
      if (local_58 == (SLNode<int> *)0x0) goto LAB_001029d3;
      pSVar5 = local_58;
    } while (local_58->val < value_local);
    if (local_58->val == value_local) {
      local_58->count = local_58->count + 1;
      std::vector<int,_std::allocator<int>_>::push_back(&local_58->valz,&value_local);
    }
    else {
LAB_001029d3:
      local_58 = pSVar6;
      pSVar4 = (SLNode<int> *)operator_new(0x48);
      pSVar4->up = (SLNode<int> *)0x0;
      pSVar4->down = (SLNode<int> *)0x0;
      pSVar4->val = iVar2;
      (pSVar4->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (pSVar4->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (pSVar4->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pSVar4->count = 1;
      keyd = (this->key).super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
      pSVar5 = pSVar6->next;
      pSVar4->next = pSVar5;
      pSVar4->back = pSVar6;
      if (pSVar5 != (SLNode<int> *)0x0) {
        pSVar5->back = pSVar4;
        pSVar6 = local_58;
      }
      pSVar6->next = pSVar4;
      if (pSVar4->next == (SLNode<int> *)0x0) {
        this->last = pSVar4;
      }
      std::vector<int,_std::allocator<int>_>::push_back(&pSVar4->valz,&value_local);
      while (rVar7 = std::uniform_real_distribution<double>::operator()(&this->dist_,&this->mt_),
            0.5 < rVar7) {
        pSVar5 = (SLNode<int> *)operator_new(0x48);
        pSVar5->back = (SLNode<int> *)0x0;
        pSVar5->next = (SLNode<int> *)0x0;
        pSVar5->up = (SLNode<int> *)0x0;
        pSVar5->val = value_local;
        (pSVar5->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        (pSVar5->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        (pSVar5->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        pSVar5->count = 1;
        pSVar4->up = pSVar5;
        pSVar5->down = pSVar4;
        pSVar4 = pSVar5;
        if (history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pSVar6 = (SLNode<int> *)operator_new(0x48);
          pSVar6->back = (SLNode<int> *)0x0;
          pSVar6->next = (SLNode<int> *)0x0;
          pSVar6->up = (SLNode<int> *)0x0;
          (pSVar6->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pSVar6->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          *(undefined8 *)
           ((long)&(pSVar6->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 4) = 0;
          *(undefined8 *)
           ((long)&(pSVar6->valz).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 4) = 0;
          keyd->up = pSVar6;
          pSVar6->down = keyd;
          pSVar6->next = pSVar5;
          pSVar5->back = pSVar6;
          keyd = pSVar6;
          std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::push_back(&this->key,&keyd);
        }
        else {
          pSVar5->next = history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish[-1]->next;
          pSVar6 = history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl
                   .super__Vector_impl_data._M_finish[-1];
          pSVar5->back = pSVar6;
          pSVar6->next = pSVar5;
          history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
        }
      }
    }
    std::_Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::~_Vector_base
              (&history.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>);
  }
  return;
}

Assistant:

void skiplist<T, X>::insert(T value) {
    ++size_;

    // If entire container empty
    if(key.empty()) {
        SLNode<T> *node = new SLNode<T>(value);
        SLNode<T> *keyd = new SLNode<T>();
        key.push_back(keyd);
        key[0]->next = node;
        node->back = key[0];
        last = node;
        // Put the value into the store
        node->valz.push_back(value);
        // Now insert some more, probabilistically
        while(this->dist_(this->mt_) > 0.5) {
            node->up = new SLNode<T>(value);
            node->up->down = node;
            node = node->up;

            keyd->up = new SLNode<T>();
            keyd->up->down = keyd;
            keyd = keyd->up;

            keyd->next = node;
            node->back = keyd;
            key.push_back(keyd);
        }
        return;
    }
    // Else
    // Find the correct position, insert
    // If not exists, create upper levels for that element

    // This is the prev nodes for all levels
    std::vector<SLNode<T>*> history;
    // Search always starts from the upper left node
    SLNode<T>* follow = key.back();
    // Go on till level 0
    while(follow->down) {
        while(follow->next && compare(follow->next->val,value))
            follow = follow->next;
        history.push_back(follow);
        follow = follow->down;
    }
    // Traverse at level 0 till dest reached
    while(follow->next && compare(follow->next->val,value))
        follow = follow->next;

    // If node already exists, add the new value to the store
    if(follow->next && _420_is_equal(follow->next->val, value, compare)) {
        follow = follow->next;
        follow->count++;
        follow->valz.push_back(value);
        return;
    }

    // Value does not exist. Insert a new node
    SLNode<T> *node = new SLNode<T>(value), *keyd = key.back();
    node->next = follow->next;
    node->back = follow;
    if(follow->next)
        follow->next->back = node;
    follow->next = node;
    if(!node->next)
        last = node;
    // Add into storage
    node->valz.push_back(value);

    // Probabilistically add more levels
    while(this->dist_(this->mt_) > 0.5) {
        node->up = new SLNode<T>(value);
        node->up->down = node;
        node = node->up;
        if(!history.empty()) {
            node->next = history.back()->next;
            node->back = history.back();
            history.back()->next = node;
            history.pop_back();
        }
        else {
            // add directly to the key
            // mess around with the pointers
            keyd->up = new SLNode<T>();
            keyd->up->down = keyd;
            keyd = keyd->up;

            keyd->next = node;
            node->back = keyd;
            key.push_back(keyd);
        }
    }
}